

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  CURLcode CVar1;
  int iVar2;
  CURLSTScode CVar3;
  Curl_llist_node *pCVar4;
  void *pvVar5;
  char *pcVar6;
  FILE *unaff_R13;
  char *tempstore;
  FILE *out;
  hsts *local_b0;
  ulong local_a8;
  curl_index i;
  tm local_90;
  curl_hstsentry e;
  
  tempstore = (char *)0x0;
  if (h == (hsts *)0x0) {
    CVar1 = CURLE_OK;
  }
  else {
    if (file == (char *)0x0) {
      file = h->filename;
    }
    CVar1 = CURLE_OK;
    if (((file != (char *)0x0) && (CVar1 = CURLE_OK, (h->flags & 2) == 0)) && (*file != '\0')) {
      CVar1 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar1 == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        local_b0 = h;
        pCVar4 = Curl_llist_head(&h->list);
        if (pCVar4 == (Curl_llist_node *)0x0) {
          CVar1 = CURLE_OK;
        }
        else {
          do {
            pvVar5 = Curl_node_elem(pCVar4);
            pCVar4 = Curl_node_next(pCVar4);
            unaff_R13 = out;
            if (*(long *)((long)pvVar5 + 0x30) == 0x7fffffffffffffff) {
              pcVar6 = "";
              if (*(char *)((long)pvVar5 + 0x28) != '\0') {
                pcVar6 = ".";
              }
              CVar1 = CURLE_OK;
              curl_mfprintf(out,"%s%s \"%s\"\n",pcVar6,*(undefined8 *)((long)pvVar5 + 0x20),
                            "unlimited");
            }
            else {
              CVar1 = Curl_gmtime(*(long *)((long)pvVar5 + 0x30),&local_90);
              if (CVar1 == CURLE_OK) {
                pcVar6 = "";
                if (*(char *)((long)pvVar5 + 0x28) != '\0') {
                  pcVar6 = ".";
                }
                local_a8 = (ulong)(uint)local_90.tm_mday;
                CVar1 = CURLE_OK;
                curl_mfprintf(unaff_R13,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar6,
                              *(undefined8 *)((long)pvVar5 + 0x20),(ulong)(local_90.tm_year + 0x76c)
                              ,(ulong)(local_90.tm_mon + 1),local_a8,(ulong)(uint)local_90.tm_hour,
                              (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
              }
            }
          } while ((CVar1 == CURLE_OK) && (pCVar4 != (Curl_llist_node *)0x0));
        }
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar1 == CURLE_OK) {
          iVar2 = Curl_rename(tempstore,file);
          CVar1 = CURLE_WRITE_ERROR;
          if (iVar2 == 0) {
            CVar1 = CURLE_OK;
          }
        }
        h = local_b0;
        if (tempstore != (char *)0x0 && CVar1 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
    if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
      i.total = Curl_llist_count(&h->list);
      i.index = 0;
      pCVar4 = Curl_llist_head(&h->list);
      if (pCVar4 != (Curl_llist_node *)0x0) {
        do {
          pvVar5 = Curl_node_elem(pCVar4);
          pCVar4 = Curl_node_next(pCVar4);
          e.name = *(char **)((long)pvVar5 + 0x20);
          e.namelen = strlen(e.name);
          e._16_1_ = e._16_1_ & 0xfe | *(byte *)((long)pvVar5 + 0x28);
          if (*(long *)((long)pvVar5 + 0x30) == 0x7fffffffffffffff) {
            builtin_strncpy(e.expire,"unlimited",10);
LAB_00132d86:
            CVar3 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
            unaff_R13 = (FILE *)(ulong)(CVar3 != CURLSTS_OK);
            CVar1 = CURLE_OK;
            if (CVar3 == CURLSTS_FAIL) {
              CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
            }
          }
          else {
            CVar1 = Curl_gmtime(*(long *)((long)pvVar5 + 0x30),&local_90);
            if (CVar1 == CURLE_OK) {
              curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",
                             (ulong)(local_90.tm_year + 0x76c),(ulong)(local_90.tm_mon + 1),
                             (ulong)(uint)local_90.tm_mday,(ulong)(uint)local_90.tm_hour,
                             (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
              goto LAB_00132d86;
            }
          }
        } while (((CVar1 == CURLE_OK) && (((ulong)unaff_R13 & 1) == 0)) &&
                (i.index = i.index + 1, pCVar4 != (Curl_llist_node *)0x0));
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length filename */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there is a write callback */
    struct curl_index i; /* count */
    i.total = Curl_llist_count(&h->list);
    i.index = 0;
    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      bool stop;
      n = Curl_node_next(e);
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}